

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

void __thiscall
tlx::CmdlineParser::add_opt_param_int(CmdlineParser *this,string *name,int *dest,string *desc)

{
  pointer *pppAVar1;
  iterator __position;
  ArgumentInt *this_00;
  string local_58;
  ArgumentInt *local_38;
  
  this_00 = (ArgumentInt *)operator_new(0x80);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
  Argument::Argument((Argument *)this_00,'\0',name,&local_58,desc,false);
  (this_00->super_Argument)._vptr_Argument = (_func_int **)&PTR__Argument_001678d0;
  this_00->dest_ = dest;
  __position._M_current =
       (this->param_list_).
       super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this_00;
  if (__position._M_current ==
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>::
    _M_realloc_insert<tlx::CmdlineParser::ArgumentInt*>
              ((vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>
                *)&this->param_list_,__position,&local_38);
  }
  else {
    *__position._M_current = (Argument *)this_00;
    pppAVar1 = &(this->param_list_).
                super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  calc_param_max(this,(this->param_list_).
                      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]);
  return;
}

Assistant:

void CmdlineParser::add_opt_param_int(
    const std::string& name, int& dest, const std::string& desc) {
    param_list_.emplace_back(new ArgumentInt(0, name, "", desc, false, dest));
    calc_param_max(param_list_.back());
}